

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::confirm::~confirm(confirm *this)

{
  ostream *poVar1;
  text *this_00;
  allocator<char> local_d2;
  allocator<char> local_d1;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [8];
  undefined8 uStack_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  text local_70;
  text local_50;
  text local_30;
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_001055fe;
    poVar1 = std::operator<<((this->super_action).os,"All ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
    poVar1 = std::operator<<(poVar1," selected ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test",&local_d1);
    pluralise(&local_70,&local_50,this->selected);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1," ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"passed.\n",&local_d2);
    local_d0 = local_c0;
    if (local_b0 == local_a0) {
      uStack_b8 = uStack_98;
    }
    else {
      local_d0 = local_b0;
    }
    local_c8 = local_a8;
    local_a8 = 0;
    local_a0[0] = 0;
    local_b0 = local_a0;
    std::operator<<(poVar1,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    poVar1 = std::operator<<(poVar1," out of ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->selected);
    poVar1 = std::operator<<(poVar1," selected ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test",&local_d1);
    pluralise(&local_70,&local_30,this->selected);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1," ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"failed.\n",&local_d2);
    local_d0 = local_c0;
    if (local_90 == local_80) {
      uStack_b8 = uStack_78;
    }
    else {
      local_d0 = local_90;
    }
    local_c8 = local_88;
    local_88 = 0;
    local_80[0] = 0;
    local_90 = local_80;
    std::operator<<(poVar1,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_30;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001055fe:
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }